

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::indent(QWidgetTextControlPrivate *this)

{
  int iVar1;
  QTextBlockFormat *this_00;
  QTextList *in_RDI;
  long in_FS_OFFSET;
  QTextList *list;
  QTextListFormat format;
  QTextBlockFormat modifier;
  QTextBlockFormat blockFmt;
  QTextList *this_01;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QTextCursor::blockFormat();
  this_00 = (QTextBlockFormat *)QTextCursor::currentList();
  if (this_00 == (QTextBlockFormat *)0x0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_28);
    QTextBlockFormat::indent((QTextBlockFormat *)0x70ff48);
    QTextBlockFormat::setIndent(this_00,(int)((ulong)in_RDI >> 0x20));
    QTextCursor::mergeBlockFormat((QTextBlockFormat *)(in_RDI + 0x88));
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x70ff77);
  }
  else {
    QTextList::format(this_01);
    QTextListFormat::indent((QTextListFormat *)0x70ffad);
    QTextListFormat::setIndent((QTextListFormat *)this_00,(int)((ulong)in_RDI >> 0x20));
    QTextCursor::block();
    iVar1 = QTextList::itemNumber((QTextBlock *)this_00);
    if (iVar1 == 1) {
      QTextList::setFormat(in_RDI,(QTextListFormat *)this_00);
    }
    else {
      QTextCursor::createList((QTextListFormat *)(in_RDI + 0x88));
    }
    QTextListFormat::~QTextListFormat((QTextListFormat *)0x71001f);
  }
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x710029);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::indent()
{
    QTextBlockFormat blockFmt = cursor.blockFormat();

    QTextList *list = cursor.currentList();
    if (!list) {
        QTextBlockFormat modifier;
        modifier.setIndent(blockFmt.indent() + 1);
        cursor.mergeBlockFormat(modifier);
    } else {
        QTextListFormat format = list->format();
        format.setIndent(format.indent() + 1);

        if (list->itemNumber(cursor.block()) == 1)
            list->setFormat(format);
        else
            cursor.createList(format);
    }
}